

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O3

DWORD Memory::RecyclerHeuristic::BackgroundFinishMarkWaitTime
                (bool backgroundFinishMarkWaitTime,ConfigFlagsTable *flags)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  if ((((int)CONCAT71(in_register_00000039,backgroundFinishMarkWaitTime) == 0) ||
      (bVar1 = Js::Phases::IsEnabled(&flags->Off,BackgroundFinishMarkPhase), bVar1)) &&
     (bVar1 = Js::Phases::IsEnabled(&flags->Force,BackgroundFinishMarkPhase), !bVar1)) {
    return 0xffffffff;
  }
  bVar1 = Js::ConfigFlagsTable::IsEnabled(flags,BackgroundFinishMarkWaitTimeFlag);
  if (bVar1) {
    uVar2 = flags->BackgroundFinishMarkWaitTime;
  }
  else {
    bVar1 = Js::Phases::IsEnabled(&flags->Force,BackgroundFinishMarkPhase);
    uVar2 = -(uint)bVar1 | 0xf;
  }
  return uVar2;
}

Assistant:

DWORD
RecyclerHeuristic::BackgroundFinishMarkWaitTime(bool backgroundFinishMarkWaitTime, Js::ConfigFlagsTable& flags)
{
    if (RECYCLER_HEURISTIC_VERSION == 10)
    {
        backgroundFinishMarkWaitTime = backgroundFinishMarkWaitTime && CUSTOM_PHASE_ON1(flags, Js::BackgroundFinishMarkPhase);
    }
    else
    {
        backgroundFinishMarkWaitTime = backgroundFinishMarkWaitTime && !CUSTOM_PHASE_OFF1(flags, Js::BackgroundFinishMarkPhase);
    }
    if (!backgroundFinishMarkWaitTime && !CUSTOM_PHASE_FORCE1(flags, Js::BackgroundFinishMarkPhase))
    {
        return INFINITE;
    }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (flags.IsEnabled(Js::BackgroundFinishMarkWaitTimeFlag))
    {
        return flags.BackgroundFinishMarkWaitTime;
    }
#endif
    if (CUSTOM_PHASE_FORCE1(flags, Js::BackgroundFinishMarkPhase))
    {
        return INFINITE;
    }
    return DefaultBackgroundFinishMarkWaitTime;
}